

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_verify_vector.cpp
# Opt level: O2

OperatorResultType
duckdb::VerifyEmitSequenceVector(DataChunk *input,DataChunk *chunk,OperatorState *state_p)

{
  LogicalTypeId LVar1;
  LogicalTypeId LVar2;
  pointer pVVar3;
  pointer pVVar4;
  bool bVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  int64_t iVar9;
  Hugeint *this;
  int64_t iVar10;
  int64_t value;
  int64_t value_00;
  reference this_00;
  InternalException *this_01;
  idx_t k;
  pointer pVVar11;
  uint64_t uVar12;
  _func_int **pp_Var13;
  ulong uVar14;
  ulong uVar15;
  pointer pVVar16;
  _func_int **pp_Var17;
  hugeint_t hVar18;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  ulong local_110;
  ConstantOrSequenceInfo local_108;
  DataChunk *local_e8;
  OperatorState *local_e0;
  hugeint_t local_d8;
  int8_t result;
  vector<duckdb::ConstantOrSequenceInfo,_true> infos;
  hugeint_t local_90;
  hugeint_t local_80;
  Value val;
  
  infos.
  super_vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>.
  super__Vector_base<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  infos.
  super_vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>.
  super__Vector_base<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  infos.
  super_vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>.
  super__Vector_base<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar15 = 0;
  local_110 = 0;
  local_e8 = input;
  local_e0 = state_p;
  do {
    pVVar16 = (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar11 = (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pVVar11 - (long)pVVar16) / 0x68) <= uVar15) {
      for (uVar15 = 0; uVar15 < (ulong)(((long)pVVar11 - (long)pVVar16) / 0x68); uVar15 = uVar15 + 1
          ) {
        this_00 = vector<duckdb::ConstantOrSequenceInfo,_true>::get<true>(&infos,uVar15);
        if ((long)(this_00->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this_00->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start >> 6 == local_110) {
          if (this_00->is_constant == true) {
            pvVar6 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar15);
            pvVar8 = vector<duckdb::Value,_true>::get<true>(&this_00->values,0);
            Vector::Reference(pvVar6,pvVar8);
          }
          else {
            pvVar8 = vector<duckdb::Value,_true>::get<true>(&this_00->values,0);
            iVar9 = Value::GetValue<long>(pvVar8);
            pvVar8 = vector<duckdb::Value,_true>::get<true>(&this_00->values,1);
            iVar10 = Value::GetValue<long>(pvVar8);
            pvVar6 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar15);
            Vector::Sequence(pvVar6,iVar9,iVar10 - iVar9,local_110);
          }
        }
        else {
          SelectionVector::SelectionVector((SelectionVector *)&val,local_110);
          for (uVar14 = 0; local_110 != uVar14; uVar14 = uVar14 + 1) {
            *(int *)(val.type_._0_8_ + uVar14 * 4) =
                 *(int *)&local_e0[1]._vptr_OperatorState + (int)uVar14;
          }
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar15);
          pvVar7 = vector<duckdb::Vector,_true>::get<true>(&local_e8->data,uVar15);
          Vector::Slice(pvVar6,pvVar7,(SelectionVector *)&val,local_110);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&val.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        pVVar16 = (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar11 = (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      chunk->count = local_110;
      pp_Var17 = (_func_int **)(local_110 + (long)local_e0[1]._vptr_OperatorState);
      bVar5 = pp_Var17 < (_func_int **)local_e8->count;
      pp_Var13 = (_func_int **)0x0;
      if (bVar5) {
        pp_Var13 = pp_Var17;
      }
      local_e0[1]._vptr_OperatorState = pp_Var13;
      ::std::vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>
      ::~vector(&infos.
                 super_vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>
               );
      return bVar5;
    }
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar15);
    LVar1 = (pvVar6->type).id_;
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar15);
    LVar2 = (pvVar6->type).id_;
    local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.is_constant = true;
    for (pp_Var13 = local_e0[1]._vptr_OperatorState; pp_Var13 < (_func_int **)local_e8->count;
        pp_Var13 = (_func_int **)((long)pp_Var13 + 1)) {
      pvVar7 = vector<duckdb::Vector,_true>::get<true>(&local_e8->data,uVar15);
      Vector::GetValue(&val,pvVar7,(idx_t)pp_Var13);
      if (local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_018d6b89:
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108,&val);
      }
      else {
        if (local_108.is_constant == true) {
          pvVar8 = vector<duckdb::Value,_true>::get<true>(&local_108.values,0);
          bVar5 = ValueOperations::DistinctFrom(&val,pvVar8);
          if (LVar2 == INTERVAL || bVar5) {
            if (((((byte)(LVar1 - TINYINT) < 4) &&
                 ((ulong)((long)local_108.values.
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.values.
                               super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start) < 0x41)) &&
                (val.is_null == false)) &&
               (pvVar8 = vector<duckdb::Value,_true>::get<true>(&local_108.values,0),
               pvVar8->is_null == false)) {
              iVar9 = Value::GetValue<long>(&val);
              hugeint_t::hugeint_t((hugeint_t *)&result,iVar9);
              pvVar8 = vector<duckdb::Value,_true>::get<true>(&local_108.values,0);
              iVar9 = Value::GetValue<long>(pvVar8);
              hugeint_t::hugeint_t(&local_d8,iVar9);
              hVar18 = hugeint_t::operator-((hugeint_t *)&result,&local_d8);
              uVar12 = hVar18.upper;
              this = (Hugeint *)hVar18.lower;
              pvVar6 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar15);
              switch((pvVar6->type).id_) {
              case TINYINT:
                input_00.upper = (int64_t)&result;
                input_00.lower = uVar12;
                bVar5 = Hugeint::TryCast<signed_char>
                                  (this,input_00,(int8_t *)&switchD_018d6b72::switchdataD_02017644);
                break;
              case SMALLINT:
                input_02.upper = (int64_t)&result;
                input_02.lower = uVar12;
                bVar5 = Hugeint::TryCast<short>
                                  (this,input_02,(int16_t *)&switchD_018d6b72::switchdataD_02017644)
                ;
                break;
              case INTEGER:
                input_01.upper = (int64_t)&result;
                input_01.lower = uVar12;
                bVar5 = Hugeint::TryCast<int>
                                  (this,input_01,(int32_t *)&switchD_018d6b72::switchdataD_02017644)
                ;
                break;
              case BIGINT:
                hVar18.upper = (int64_t)&result;
                hVar18.lower = uVar12;
                bVar5 = Hugeint::TryCast<long>
                                  (this,hVar18,(int64_t *)&switchD_018d6b72::switchdataD_02017644);
                break;
              default:
                this_01 = (InternalException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&result,"Unsupported sequence type",(allocator *)&local_d8);
                InternalException::InternalException(this_01,(string *)&result);
                __cxa_throw(this_01,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              if (bVar5 != false) {
                ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
                emplace_back<duckdb::Value>
                          ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108,&val)
                ;
                local_108.is_constant = false;
                goto LAB_018d6cb0;
              }
            }
            goto LAB_018d6cc0;
          }
          goto LAB_018d6b89;
        }
        if (val.is_null != false) {
LAB_018d6cc0:
          Value::~Value(&val);
          break;
        }
        pvVar8 = vector<duckdb::Value,_true>::get<true>(&local_108.values,0);
        iVar9 = Value::GetValue<long>(pvVar8);
        pvVar8 = vector<duckdb::Value,_true>::get<true>(&local_108.values,1);
        iVar10 = Value::GetValue<long>(pvVar8);
        pvVar8 = vector<duckdb::Value,_true>::back(&local_108.values);
        value = Value::GetValue<long>(pvVar8);
        value_00 = Value::GetValue<long>(&val);
        hugeint_t::hugeint_t((hugeint_t *)&result,value_00);
        hugeint_t::hugeint_t(&local_80,value);
        hugeint_t::hugeint_t(&local_90,iVar10 - iVar9);
        local_d8 = hugeint_t::operator+(&local_80,&local_90);
        bVar5 = hugeint_t::operator==((hugeint_t *)&result,&local_d8);
        if (!bVar5) goto LAB_018d6cc0;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108,&val);
      }
LAB_018d6cb0:
      Value::~Value(&val);
    }
    pVVar4 = local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar3 = local_108.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    ::std::vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>::
    emplace_back<duckdb::ConstantOrSequenceInfo>
              (&infos.
                super_vector<duckdb::ConstantOrSequenceInfo,_std::allocator<duckdb::ConstantOrSequenceInfo>_>
               ,&local_108);
    uVar14 = (long)pVVar4 - (long)pVVar3 >> 6;
    if (local_110 < uVar14) {
      local_110 = uVar14;
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108);
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

OperatorResultType VerifyEmitSequenceVector(const DataChunk &input, DataChunk &chunk, OperatorState &state_p) {
	auto &state = state_p.Cast<VerifyVectorState>();
	D_ASSERT(state.const_idx < input.size());

	// find the longest length sequence or constant vector to emit
	vector<ConstantOrSequenceInfo> infos;
	idx_t max_length = 0;
	for (idx_t c = 0; c < chunk.ColumnCount(); c++) {
		bool can_be_sequence = false;
		switch (chunk.data[c].GetType().id()) {
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT: {
			can_be_sequence = true;
			break;
		}
		default: {
			break;
		}
		}
		bool can_be_constant = true;
		switch (chunk.data[c].GetType().id()) {
		case LogicalTypeId::INTERVAL:
			can_be_constant = false;
			break;
		default:
			break;
		}
		ConstantOrSequenceInfo info;
		info.is_constant = true;
		for (idx_t k = state.const_idx; k < input.size(); k++) {
			auto val = input.data[c].GetValue(k);
			if (info.values.empty()) {
				info.values.push_back(std::move(val));
			} else if (info.is_constant) {
				if (!ValueOperations::DistinctFrom(val, info.values[0]) && can_be_constant) {
					// found the same value! continue
					info.values.push_back(std::move(val));
					continue;
				}
				// not the same value - can we convert this into a sequence vector?
				if (!can_be_sequence) {
					break;
				}
				// we can only convert to a sequence if we have only gathered one value
				// otherwise we would have multiple identical values here already
				if (info.values.size() > 1) {
					break;
				}
				// cannot create a sequence with null values
				if (val.IsNull() || info.values[0].IsNull()) {
					break;
				}
				// check if the increment fits in the target type
				// i.e. we cannot have a sequence vector with an increment of 200 in `int8_t`
				auto increment = hugeint_t(val.GetValue<int64_t>()) - hugeint_t(info.values[0].GetValue<int64_t>());
				bool increment_fits = true;
				switch (chunk.data[c].GetType().id()) {
				case LogicalTypeId::TINYINT: {
					int8_t result;
					if (!Hugeint::TryCast<int8_t>(increment, result)) {
						increment_fits = false;
					}
					break;
				}
				case LogicalTypeId::SMALLINT: {
					int16_t result;
					if (!Hugeint::TryCast<int16_t>(increment, result)) {
						increment_fits = false;
					}
					break;
				}
				case LogicalTypeId::INTEGER: {
					int32_t result;
					if (!Hugeint::TryCast<int32_t>(increment, result)) {
						increment_fits = false;
					}
					break;
				}
				case LogicalTypeId::BIGINT: {
					int64_t result;
					if (!Hugeint::TryCast<int64_t>(increment, result)) {
						increment_fits = false;
					}
					break;
				}
				default:
					throw InternalException("Unsupported sequence type");
				}
				if (!increment_fits) {
					break;
				}
				info.values.push_back(std::move(val));
				info.is_constant = false;
				continue;
			} else {
				D_ASSERT(info.values.size() >= 2);
				// sequence vector - check if this value is on the trajectory
				if (val.IsNull()) {
					// not on trajectory - this value is null
					break;
				}
				int64_t start = info.values[0].GetValue<int64_t>();
				int64_t increment = info.values[1].GetValue<int64_t>() - start;
				int64_t last_value = info.values.back().GetValue<int64_t>();
				if (hugeint_t(val.GetValue<int64_t>()) == hugeint_t(last_value) + hugeint_t(increment)) {
					// value still fits in the sequence
					info.values.push_back(std::move(val));
					continue;
				}
				// value no longer fits into the sequence - break
				break;
			}
		}
		if (info.values.size() > max_length) {
			max_length = info.values.size();
		}
		infos.push_back(std::move(info));
	}
	// go over each of the columns again and construct either (1) a dictionary vector, or (2) a constant/sequence vector
	for (idx_t c = 0; c < chunk.ColumnCount(); c++) {
		auto &info = infos[c];
		if (info.values.size() != max_length) {
			// dictionary vector
			SelectionVector sel(max_length);
			for (idx_t k = 0; k < max_length; k++) {
				sel.set_index(k, state.const_idx + k);
			}
			chunk.data[c].Slice(input.data[c], sel, max_length);
		} else if (info.is_constant) {
			// constant vector
			chunk.data[c].Reference(info.values[0]);
		} else {
			// sequence vector
			int64_t start = info.values[0].GetValue<int64_t>();
			int64_t increment = info.values[1].GetValue<int64_t>() - start;
			chunk.data[c].Sequence(start, increment, max_length);
		}
	}
	chunk.SetCardinality(max_length);
	state.const_idx += max_length;
	if (state.const_idx >= input.size()) {
		state.const_idx = 0;
		return OperatorResultType::NEED_MORE_INPUT;
	}
	return OperatorResultType::HAVE_MORE_OUTPUT;
}